

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::setSize
          (Image<float,_gimage::PixelTraits<float>_> *this,long w,long h,long d)

{
  long k;
  ulong uVar1;
  float *pfVar2;
  float **ppfVar3;
  float ***pppfVar4;
  long lVar5;
  runtime_error *this_00;
  ulong uVar6;
  int iVar7;
  
  if (((this->width != w) || (this->height != h)) || (this->depth != d)) {
    if (this->n < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Cannot change size, because image is used as a wrapper");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->pixel != (float *)0x0) {
      operator_delete__(this->pixel);
    }
    if (this->row != (float **)0x0) {
      operator_delete__(this->row);
    }
    if (this->img != (float ***)0x0) {
      operator_delete__(this->img);
    }
    iVar7 = (int)d;
    this->depth = iVar7;
    this->width = w;
    this->height = h;
    uVar1 = h * w * (long)iVar7;
    this->n = uVar1;
    this->img = (float ***)0x0;
    this->pixel = (float *)0x0;
    this->row = (float **)0x0;
    if (0 < (long)uVar1) {
      uVar6 = iVar7 * h;
      pfVar2 = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
      this->pixel = pfVar2;
      ppfVar3 = (float **)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
      this->row = ppfVar3;
      uVar1 = 0xffffffffffffffff;
      if (-1 < iVar7) {
        uVar1 = (d << 0x20) >> 0x1d;
      }
      pppfVar4 = (float ***)operator_new__(uVar1);
      this->img = pppfVar4;
      *ppfVar3 = pfVar2;
      for (lVar5 = 1; ppfVar3 = this->row, lVar5 < (long)uVar6; lVar5 = lVar5 + 1) {
        ppfVar3[lVar5] = ppfVar3[lVar5 + -1] + w;
      }
      *this->img = ppfVar3;
      for (lVar5 = 1; lVar5 < iVar7; lVar5 = lVar5 + 1) {
        this->img[lVar5] = this->img[lVar5 + -1] + h;
      }
    }
  }
  return;
}

Assistant:

void setSize(long w, long h, long d)
    {
      if (width != w || height != h || depth != d)
      {
        if (n < 0)
        {
          throw std::runtime_error("Cannot change size, because image is used as a wrapper");
        }

        if (pixel != 0)
        {
          delete [] pixel;
        }

        if (row != 0)
        {
          delete [] row;
        }

        if (img != 0)
        {
          delete [] img;
        }

        depth=d;
        width=w;
        height=h;
        n=width*height*depth;

        pixel=0;
        row=0;
        img=0;

        if (n > 0)
        {
          long m=height*depth;

          pixel=new T[n];
          row=new T*[m];
          img=new T **[depth];

          row[0]=pixel;

          for (long k=1; k<m; k++)
          {
            row[k]=row[k-1]+width;
          }

          img[0]=row;

          for (int j=1; j<depth; j++)
          {
            img[j]=img[j-1]+height;
          }
        }
      }
    }